

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detokenize.c
# Opt level: O2

void av1_decode_palette_tokens(MACROBLOCKD *xd,int plane,aom_reader *r)

{
  uint uVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  FRAME_CONTEXT *pFVar7;
  byte bVar8;
  byte bVar9;
  short sVar10;
  int iVar11;
  int iVar12;
  uint8_t *color_map;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  ulong __n;
  uint uVar16;
  ulong uVar17;
  uint8_t *__s;
  int iVar18;
  uint16_t *icdf;
  bool bVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  uint8_t *puVar27;
  uint local_80;
  uint8_t local_38 [8];
  
  puVar27 = xd->plane[plane].color_index_map;
  uVar4 = xd->color_index_map_offset[plane];
  color_map = puVar27 + uVar4;
  lVar25 = 0x294e;
  if (plane == 0) {
    lVar25 = 0x26d8;
  }
  pFVar7 = xd->tile_ctx;
  BVar2 = (*xd->mi)->bsize;
  bVar3 = (byte)xd->plane[plane].subsampling_x;
  bVar13 = (byte)xd->plane[plane].subsampling_y;
  bVar8 = block_size_wide[BVar2] >> (bVar3 & 0x1f);
  bVar9 = block_size_high[BVar2] >> (bVar13 & 0x1f);
  bVar19 = bVar8 < 4 && 0 < plane;
  iVar21 = (int)((xd->mb_to_right_edge >> 0x1f & xd->mb_to_right_edge >> 3) +
                (uint)block_size_wide[BVar2]) >> (bVar3 & 0x1f);
  bVar3 = ((*xd->mi)->palette_mode_info).palette_size[plane];
  uVar22 = (ulong)bVar3;
  uVar16 = 0x1f;
  if (bVar3 != 0) {
    for (; bVar3 >> uVar16 == 0; uVar16 = uVar16 - 1) {
    }
  }
  iVar14 = (uVar16 ^ 0xffffffe0) + 0x21;
  uVar16 = (uint)bVar8 + (uint)bVar19 * 2;
  uVar23 = (uint)(bVar9 < 4 && 0 < plane);
  if (bVar3 == 0) {
    iVar14 = 0;
  }
  uVar1 = ((int)((xd->mb_to_bottom_edge >> 0x1f & xd->mb_to_bottom_edge >> 3) +
                (uint)block_size_high[BVar2]) >> (bVar13 & 0x1f)) + uVar23 * 2;
  iVar11 = iVar21 + (uint)bVar19 * 2;
  iVar18 = (1 << ((byte)iVar14 & 0x1f)) - (uint)bVar3;
  iVar14 = aom_read_literal_(r,iVar14 + -1);
  if (iVar18 <= iVar14) {
    iVar12 = aom_read_literal_(r,1);
    iVar14 = (iVar14 * 2 - iVar18) + iVar12;
  }
  *color_map = (uint8_t)iVar14;
  uVar15 = (ulong)(iVar11 + -1);
  __n = (ulong)uVar16;
  for (uVar17 = 1; (long)uVar17 < (long)(int)(uVar1 + iVar11 + -1); uVar17 = uVar17 + 1) {
    uVar26 = uVar15;
    if ((long)uVar17 < (long)uVar15) {
      uVar26 = uVar17;
    }
    iVar14 = (int)uVar17;
    uVar24 = uVar15;
    if (iVar14 < iVar11 + -1) {
      uVar24 = uVar17;
    }
    uVar24 = uVar24 & 0xffffffff;
    iVar18 = iVar14 - uVar1;
    if ((int)(iVar14 - uVar1) < 0) {
      iVar18 = -1;
    }
    for (; (long)iVar18 < (long)uVar26; uVar26 = uVar26 - 1) {
      iVar12 = av1_get_palette_color_index_context
                         (color_map,uVar16,iVar14 - (int)uVar24,(int)uVar26,(uint)bVar3,local_38,
                          (int *)0x0);
      icdf = (uint16_t *)((long)pFVar7 + (long)iVar12 * 0x12 + uVar22 * 0x5a + lVar25 + -0xb4);
      iVar12 = od_ec_decode_cdf_q15(&r->ec,icdf,(uint)bVar3);
      if (r->allow_update_cdf != '\0') {
        uVar5 = icdf[uVar22];
        bVar13 = (char)(uVar5 >> 4) + (3 < bVar3) + 4;
        lVar20 = 0;
        do {
          uVar6 = icdf[lVar20];
          if (lVar20 < (char)iVar12) {
            sVar10 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar13 & 0x1f));
          }
          else {
            sVar10 = -(uVar6 >> (bVar13 & 0x1f));
          }
          icdf[lVar20] = sVar10 + uVar6;
          lVar20 = lVar20 + 1;
        } while (lVar20 < (long)(uVar22 - 1));
        icdf[uVar22] = icdf[uVar22] + (ushort)(uVar5 < 0x20);
      }
      color_map[uVar26 + (uVar17 - uVar26) * __n] = local_38[iVar12];
      uVar24 = (ulong)((int)uVar24 - 1);
    }
  }
  lVar25 = (long)(int)uVar1;
  local_80 = (uint)bVar8;
  if (iVar21 < (int)local_80) {
    __s = color_map + iVar11;
    uVar22 = 0;
    if (0 < (int)uVar1) {
      uVar22 = (ulong)uVar1;
    }
    while (bVar19 = uVar22 != 0, uVar22 = uVar22 - 1, bVar19) {
      memset(__s,(uint)__s[-1],(long)(int)(uVar16 - iVar11));
      __s = __s + __n;
    }
  }
  puVar27 = puVar27 + lVar25 * __n + (ulong)uVar4;
  for (; lVar25 < (long)(ulong)((uint)bVar9 + uVar23 * 2); lVar25 = lVar25 + 1) {
    memcpy(puVar27,color_map + (int)((uVar1 - 1) * uVar16),__n);
    puVar27 = puVar27 + __n;
  }
  return;
}

Assistant:

void av1_decode_palette_tokens(MACROBLOCKD *const xd, int plane,
                               aom_reader *r) {
  assert(plane == 0 || plane == 1);
  Av1ColorMapParam params;
  params.color_map =
      xd->plane[plane].color_index_map + xd->color_index_map_offset[plane];
  params.map_cdf = plane ? xd->tile_ctx->palette_uv_color_index_cdf
                         : xd->tile_ctx->palette_y_color_index_cdf;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  params.n_colors = mbmi->palette_mode_info.palette_size[plane];
  av1_get_block_dimensions(mbmi->bsize, plane, xd, &params.plane_width,
                           &params.plane_height, &params.rows, &params.cols);
  decode_color_map_tokens(&params, r);
}